

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.cpp
# Opt level: O0

void __thiscall Al::internal::ProgressEngine::ProgressEngine(ProgressEngine *this)

{
  long in_RDI;
  ProgressEngine *in_stack_00000050;
  undefined1 in_stack_ffffffffffffff7f;
  InputQueue *in_stack_ffffffffffffff80;
  __int_type_conflict in_stack_ffffffffffffff88;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff90;
  undefined8 local_20;
  
  std::thread::thread((thread *)0x135ee1);
  std::mutex::mutex((mutex *)0x135eef);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x38));
  local_20 = in_RDI + 0x80;
  do {
    InputQueue::InputQueue(in_stack_ffffffffffffff80);
    local_20 = local_20 + 0x200;
  } while (local_20 != in_RDI + 0x8080);
  std::
  unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
  ::unordered_map((unordered_map<void_*,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>_>
                   *)0x135f75);
  *(undefined8 *)(in_RDI + 0x80c0) = 0;
  *(undefined4 *)(in_RDI + 0x80c8) = 0xffffffff;
  std::atomic<bool>::operator=
            ((atomic<bool> *)in_stack_ffffffffffffff80,(bool)in_stack_ffffffffffffff7f);
  std::atomic<bool>::operator=
            ((atomic<bool> *)in_stack_ffffffffffffff80,(bool)in_stack_ffffffffffffff7f);
  std::atomic<bool>::operator=
            ((atomic<bool> *)in_stack_ffffffffffffff80,(bool)in_stack_ffffffffffffff7f);
  std::__atomic_base<unsigned_long>::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  bind_init(in_stack_00000050);
  return;
}

Assistant:

ProgressEngine::ProgressEngine() {
  stop_flag = false;
  started_flag = false;
#ifdef AL_PE_START_ON_DEMAND
  doing_start_flag = false;
#endif
#ifdef AL_PE_ADD_DEFAULT_STREAM
  // Initialze with the default stream.
  num_input_streams = 1;
#else
  num_input_streams = 0;
#endif
#ifdef AL_HAS_CUDA
  // Capture the current CUDA device for the progress engine.
  int device;
  AL_CHECK_CUDA(AlGpuGetDevice(&device));
  cur_device = device;
#endif
#ifdef AL_USE_HWLOC
  bind_init();
#endif
}